

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

int __thiscall PP_Expression::unary_expression(PP_Expression *this)

{
  qsizetype *pqVar1;
  Token TVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  uVar5 = 0;
switchD_00129887_caseD_3d:
  TVar2 = Parser::next(&this->super_Parser);
  switch(TVar2) {
  case PLUS:
    goto switchD_00129887_caseD_3d;
  case MINUS:
    goto switchD_00129887_caseD_3e;
  case PP_STAR:
  case PP_SLASH:
  case PERCENT:
  case HAT:
  case AND:
  case OR:
    goto switchD_00129887_caseD_3f;
  case PP_TILDE:
    break;
  case NOT:
    iVar4 = unary_expression(this);
    uVar3 = (uint)(iVar4 == 0);
    goto LAB_001298d6;
  default:
    if (TVar2 == PP_MOC_TRUE) {
      uVar3 = 1;
      goto LAB_001298d6;
    }
    if (TVar2 == PP_MOC_FALSE) {
      uVar3 = 0;
      goto LAB_001298d6;
    }
switchD_00129887_caseD_3f:
    pqVar1 = &(this->super_Parser).index;
    *pqVar1 = *pqVar1 + -1;
    uVar3 = primary_expression(this);
    goto LAB_001298d6;
  }
  uVar5 = ~uVar5;
  goto switchD_00129887_caseD_3d;
switchD_00129887_caseD_3e:
  iVar4 = unary_expression(this);
  uVar3 = -iVar4;
LAB_001298d6:
  return uVar3 ^ uVar5;
}

Assistant:

int PP_Expression::unary_expression()
{
    switch (next()) {
    case PP_PLUS:
        return unary_expression();
    case PP_MINUS:
        return -unary_expression();
    case PP_NOT:
        return !unary_expression();
    case PP_TILDE:
        return ~unary_expression();
    case PP_MOC_TRUE:
        return 1;
    case PP_MOC_FALSE:
        return 0;
    default:
        prev();
        return primary_expression();
    }
}